

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O0

void __thiscall SDT::Loc::dfs(Loc *this,TreeNode *treeNode,SDTNode *fa)

{
  int line;
  bool bVar1;
  LocP *pLVar2;
  reference pvVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  string local_58 [48];
  LocP *local_28;
  LocP *locP_1;
  SDTNode *fa_local;
  TreeNode *treeNode_local;
  Loc *this_local;
  
  locP_1 = (LocP *)fa;
  fa_local = (SDTNode *)treeNode;
  treeNode_local = (TreeNode *)this;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&treeNode->sons);
  if (!bVar1) {
    pLVar2 = (LocP *)operator_new(0x68);
    LocP::LocP(pLVar2);
    local_28 = pLVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)fa_local,0);
    pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[](&resultTree,(long)*pvVar3)
    ;
    bVar1 = checkvar(&pvVar4->attr);
    if (bVar1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,0);
      pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar3);
      std::__cxx11::string::operator=((string *)&this->lName,(string *)&pvVar4->attr);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,0);
      pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar3);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                             *)vars_abi_cxx11_,&pvVar4->attr);
      std::__cxx11::string::operator=((string *)&local_28->type,(string *)pmVar5);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,0);
      pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar3);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)varwidth_abi_cxx11_,&pvVar4->attr);
      pLVar2 = local_28;
      local_28->width = *pmVar6;
      inEval = 1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,1);
      pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                         (&resultTree,(long)*pvVar3);
      (**(pLVar2->super_SDTNode)._vptr_SDTNode)(pLVar2,pvVar4,this);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)fa_local,0);
        pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                           (&resultTree,(long)*pvVar3);
        std::operator+(local_b8,(char *)&pvVar4->attr);
        std::operator+(local_98,local_b8);
        std::operator+(local_78,(char *)local_98);
        std::__cxx11::string::operator=((string *)&this->addr,(string *)local_78);
        std::__cxx11::string::~string((string *)local_78);
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string((string *)local_b8);
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)fa_local,0);
        pvVar4 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                           (&resultTree,(long)*pvVar3);
        std::__cxx11::string::operator=((string *)&this->addr,(string *)&pvVar4->attr);
      }
    }
    else {
      line = *(int *)&fa_local[2].sons.
                      super__Vector_base<SDT::SDTNode_*,_std::allocator<SDT::SDTNode_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)fa_local,0);
      std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[](&resultTree,(long)*pvVar3);
      std::operator+((char *)local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Not declared ");
      ERROR(line,local_58);
      std::__cxx11::string::~string((string *)local_58);
    }
  }
  return;
}

Assistant:

virtual void dfs(TreeNode &treeNode,SDTNode *fa) {
            if (treeNode.sons.empty()) return;
            LocP *locP_1 = new LocP;
            if(!checkvar(TNAME(0))){
                ERROR(treeNode.lineNum,"Not declared "+TNAME(0));
                return;
            }
            lName = TNAME(0);
            locP_1->type = vars[TNAME(0)].first;
            locP_1->width = varwidth[TNAME(0)];
            inEval=true;
            locP_1->dfs(SON(1));
            if(!locP_1->offset.empty())addr=TNAME(0)+"["+locP_1->offset+"]";
            else addr = TNAME(0);

        }